

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::MeasuredMaterial::ToString_abi_cxx11_(MeasuredMaterial *this)

{
  string *in_RDI;
  FloatTextureHandle *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::FloatTextureHandle_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string MeasuredMaterial::ToString() const {
    return StringPrintf("[ MeasuredMaterial displacement: %s ]", displacement);
}